

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::GregorianCalendar::handleComputeJulianDay
          (GregorianCalendar *this,UCalendarDateFields bestField)

{
  int32_t iVar1;
  int32_t weekShift;
  int32_t gregShift;
  int32_t jd;
  UCalendarDateFields bestField_local;
  GregorianCalendar *this_local;
  
  this->fInvertGregorian = '\0';
  weekShift = Calendar::handleComputeJulianDay(&this->super_Calendar,bestField);
  if (((bestField == UCAL_WEEK_OF_YEAR) &&
      (iVar1 = Calendar::internalGet(&this->super_Calendar,UCAL_EXTENDED_YEAR),
      iVar1 == this->fGregorianCutoverYear)) && (this->fCutoverJulianDay <= weekShift)) {
    this->fInvertGregorian = '\x01';
    this_local._4_4_ = Calendar::handleComputeJulianDay(&this->super_Calendar,UCAL_WEEK_OF_YEAR);
  }
  else {
    if ((this->fIsGregorian == '\x01') != this->fCutoverJulianDay <= weekShift) {
      this->fInvertGregorian = '\x01';
      weekShift = Calendar::handleComputeJulianDay(&this->super_Calendar,bestField);
    }
    if ((this->fIsGregorian != '\0') &&
       (iVar1 = Calendar::internalGet(&this->super_Calendar,UCAL_EXTENDED_YEAR),
       iVar1 == this->fGregorianCutoverYear)) {
      iVar1 = Calendar::internalGet(&this->super_Calendar,UCAL_EXTENDED_YEAR);
      iVar1 = Grego::gregorianShift(iVar1);
      if (bestField == UCAL_DAY_OF_YEAR) {
        weekShift = weekShift - iVar1;
      }
      else if (bestField == UCAL_WEEK_OF_MONTH) {
        weekShift = weekShift + 0xe;
      }
    }
    this_local._4_4_ = weekShift;
  }
  return this_local._4_4_;
}

Assistant:

int32_t GregorianCalendar::handleComputeJulianDay(UCalendarDateFields bestField) 
{
    fInvertGregorian = FALSE;

    int32_t jd = Calendar::handleComputeJulianDay(bestField);

    if((bestField == UCAL_WEEK_OF_YEAR) &&  // if we are doing WOY calculations, we are counting relative to Jan 1 *julian*
        (internalGet(UCAL_EXTENDED_YEAR)==fGregorianCutoverYear) && 
        jd >= fCutoverJulianDay) { 
            fInvertGregorian = TRUE;  // So that the Julian Jan 1 will be used in handleComputeMonthStart
            return Calendar::handleComputeJulianDay(bestField);
        }


        // The following check handles portions of the cutover year BEFORE the
        // cutover itself happens.
        //if ((fIsGregorian==TRUE) != (jd >= fCutoverJulianDay)) {  /*  cutoverJulianDay)) { */
        if ((fIsGregorian==TRUE) != (jd >= fCutoverJulianDay)) {  /*  cutoverJulianDay)) { */
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d: jd [invert] %d\n", 
                __FILE__, __LINE__, jd);
#endif
            fInvertGregorian = TRUE;
            jd = Calendar::handleComputeJulianDay(bestField);
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d:  fIsGregorian %s, fInvertGregorian %s - ", 
                __FILE__, __LINE__,fIsGregorian?"T":"F", fInvertGregorian?"T":"F");
            fprintf(stderr, " jd NOW %d\n", 
                jd);
#endif
        } else {
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d: jd [==] %d - %sfIsGregorian %sfInvertGregorian, %d\n", 
                __FILE__, __LINE__, jd, fIsGregorian?"T":"F", fInvertGregorian?"T":"F", bestField);
#endif
        }

        if(fIsGregorian && (internalGet(UCAL_EXTENDED_YEAR) == fGregorianCutoverYear)) {
            int32_t gregShift = Grego::gregorianShift(internalGet(UCAL_EXTENDED_YEAR));
            if (bestField == UCAL_DAY_OF_YEAR) {
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "%s:%d: [DOY%d] gregorian shift of JD %d += %d\n", 
                    __FILE__, __LINE__, fFields[bestField],jd, gregShift);
#endif
                jd -= gregShift;
            } else if ( bestField == UCAL_WEEK_OF_MONTH ) {
                int32_t weekShift = 14;
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "%s:%d: [WOY/WOM] gregorian week shift of %d += %d\n", 
                    __FILE__, __LINE__, jd, weekShift);
#endif
                jd += weekShift; // shift by weeks for week based fields.
            }
        }

        return jd;
}